

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_send(uv_loop_t *loop)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int local_24;
  int r;
  int fd;
  ssize_t len;
  void *buf;
  uv_loop_t *loop_local;
  
  len = (long)"HTTP/1.1 200 OK\r\nContent-Length: %ld\r\nContent-Type: %s\r\nConnection: %s\r\n\r\n"
        + 0x4a;
  _r = 1;
  local_24 = loop->async_wfd;
  if (local_24 == -1) {
    len = (ssize_t)&uv__async_send::val;
    _r = 8;
    local_24 = (loop->async_io_watcher).fd;
  }
  do {
    sVar2 = write(local_24,(void *)len,_r);
    iVar1 = (int)sVar2;
    bVar4 = false;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if (((long)iVar1 != _r) &&
     ((iVar1 != -1 ||
      ((piVar3 = __errno_location(), *piVar3 != 0xb && (piVar3 = __errno_location(), *piVar3 != 0xb)
       ))))) {
    abort();
  }
  return;
}

Assistant:

static void uv__async_send(uv_loop_t* loop) {
  const void* buf;
  ssize_t len;
  int fd;
  int r;

  buf = "";
  len = 1;
  fd = loop->async_wfd;

#if defined(__linux__)
  if (fd == -1) {
    static const uint64_t val = 1;
    buf = &val;
    len = sizeof(val);
    fd = loop->async_io_watcher.fd;  /* eventfd */
  }
#endif

  do
    r = write(fd, buf, len);
  while (r == -1 && errno == EINTR);

  if (r == len)
    return;

  if (r == -1)
    if (errno == EAGAIN || errno == EWOULDBLOCK)
      return;

  abort();
}